

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O0

Texture * rw::gl3::readNativeTexture(Stream *stream)

{
  FILE *pFVar1;
  bool bVar2;
  uint32 uVar3;
  int32 width_00;
  int32 height_00;
  int32 depth_00;
  int32 numLevels_00;
  int32 iVar4;
  char *pcVar5;
  uint8 *puVar6;
  int local_8c;
  int32 i;
  uint8 *data;
  uint32 local_78;
  uint32 size;
  Error _e_3;
  Gl3Raster *natras;
  Raster *raster;
  Error _e_2;
  int32 compression;
  int32 flags;
  int32 subplatform;
  int32 numLevels;
  int32 depth;
  int32 height;
  int32 width;
  uint32 format;
  Texture *tex;
  undefined4 local_28;
  Error _e_1;
  Error _e;
  uint32 platform;
  Stream *stream_local;
  
  bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar2) {
    uVar3 = Stream::readU32(stream);
    if (uVar3 == 0xc) {
      stream_local = (Stream *)Texture::create((Raster *)0x0);
      if ((Texture *)stream_local == (Texture *)0x0) {
        stream_local = (Stream *)0x0;
      }
      else {
        uVar3 = Stream::readU32(stream);
        ((Texture *)stream_local)->filterAddressing = uVar3;
        (*stream->_vptr_Stream[4])(stream,((Texture *)stream_local)->name,0x20);
        (*stream->_vptr_Stream[4])(stream,((Texture *)stream_local)->mask,0x20);
        uVar3 = Stream::readU32(stream);
        width_00 = Stream::readI32(stream);
        height_00 = Stream::readI32(stream);
        depth_00 = Stream::readI32(stream);
        numLevels_00 = Stream::readI32(stream);
        iVar4 = Stream::readI32(stream);
        _e_2.code = Stream::readI32(stream);
        _e_2.plugin = Stream::readI32(stream);
        if (iVar4 == gl3Caps) {
          if ((_e_2.code & 2) == 0) {
            natras = (Gl3Raster *)Raster::create(width_00,height_00,depth_00,uVar3 | 4,0xc);
          }
          else {
            if ((DAT_00168c90 & 1) == 0) {
              Texture::destroy((Texture *)stream_local);
              local_78 = 0xb00;
              size = 0x8000000c;
              fprintf(_stderr,"%s:%d: ",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/gl3raster.cpp"
                      ,0x3a6);
              pFVar1 = _stderr;
              pcVar5 = dbgsprint(0x8000000c);
              fprintf(pFVar1,"%s\n",pcVar5);
              setError((Error *)&stack0xffffffffffffff88);
              return (Texture *)0x0;
            }
            natras = (Gl3Raster *)Raster::create(width_00,height_00,depth_00,uVar3 | 0x84,0xc);
            allocateDXT((Raster *)natras,_e_2.plugin,numLevels_00,_e_2.code & 1);
          }
          _e_3 = (Error)((long)&natras->internalFormat + (long)nativeRasterOffset);
          ((Texture *)stream_local)->raster = (Raster *)natras;
          for (local_8c = 0; local_8c < numLevels_00; local_8c = local_8c + 1) {
            uVar3 = Stream::readU32(stream);
            puVar6 = Raster::lock((Raster *)natras,local_8c,5);
            (*stream->_vptr_Stream[4])(stream,puVar6,(ulong)uVar3);
            Raster::unlock((Raster *)natras,local_8c);
          }
        }
        else {
          Texture::destroy((Texture *)stream_local);
          raster._0_4_ = 0xb00;
          raster._4_4_ = 0x80000006;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/gl3raster.cpp"
                  ,0x39d);
          pFVar1 = _stderr;
          pcVar5 = dbgsprint(0x80000006,0xc);
          fprintf(pFVar1,"%s\n",pcVar5);
          setError((Error *)&raster);
          stream_local = (Stream *)0x0;
        }
      }
    }
    else {
      tex._4_4_ = 0xb00;
      local_28 = 0x80000006;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/gl3raster.cpp"
              ,899);
      pFVar1 = _stderr;
      pcVar5 = dbgsprint(0x80000006,(ulong)uVar3);
      fprintf(pFVar1,"%s\n",pcVar5);
      setError((Error *)((long)&tex + 4));
      stream_local = (Stream *)0x0;
    }
  }
  else {
    _e_1.plugin = 0xb00;
    _e_1.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/gl3raster.cpp"
            ,0x37e);
    pFVar1 = _stderr;
    pcVar5 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar1,"%s\n",pcVar5);
    setError(&_e_1);
    stream_local = (Stream *)0x0;
  }
  return (Texture *)stream_local;
}

Assistant:

Texture*
readNativeTexture(Stream *stream)
{
	uint32 platform;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_GL3){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	Texture *tex = Texture::create(nil);
	if(tex == nil)
		return nil;

	// Texture
	tex->filterAddressing = stream->readU32();
	stream->read8(tex->name, 32);
	stream->read8(tex->mask, 32);

	// Raster
	uint32 format = stream->readU32();
	int32 width = stream->readI32();
	int32 height = stream->readI32();
	int32 depth = stream->readI32();
	int32 numLevels = stream->readI32();

	// Native raster
	int32 subplatform = stream->readI32();
	int32 flags = stream->readI32();
	int32 compression = stream->readI32();

	if(subplatform != gl3Caps.gles){
		tex->destroy();
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}

	Raster *raster;
	Gl3Raster *natras;
	if(flags & 2){
		if(!gl3Caps.dxtSupported){
			tex->destroy();
			RWERROR((ERR_FORMAT_UNSUPPORTED));
			return nil;
		}
		raster = Raster::create(width, height, depth, format | Raster::TEXTURE | Raster::DONTALLOCATE, PLATFORM_GL3);
		allocateDXT(raster, compression, numLevels, flags & 1);
	}else{
		raster = Raster::create(width, height, depth, format | Raster::TEXTURE, PLATFORM_GL3);
	}
	assert(raster);
	natras = GETGL3RASTEREXT(raster);
	tex->raster = raster;

	uint32 size;
	uint8 *data;
	for(int32 i = 0; i < numLevels; i++){
		size = stream->readU32();
		data = raster->lock(i, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		stream->read8(data, size);
		raster->unlock(i);
	}
	return tex;
}